

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionSave.cpp
# Opt level: O0

void __thiscall
Hpipe::InstructionSave::InstructionSave(InstructionSave *this,Context *cx,uint num_save)

{
  Context local_90;
  uint local_1c;
  Context *pCStack_18;
  uint num_save_local;
  Context *cx_local;
  InstructionSave *this_local;
  
  local_1c = num_save;
  pCStack_18 = cx;
  cx_local = (Context *)this;
  Context::Context(&local_90,cx);
  Instruction::Instruction(&this->super_Instruction,&local_90);
  Context::~Context(&local_90);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR__InstructionSave_00290898;
  *(uint *)&(this->super_Instruction).field_0x174 = local_1c;
  return;
}

Assistant:

InstructionSave::InstructionSave( const Context &cx, unsigned num_save ) : Instruction( cx ), num_save( num_save ) {

}